

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv.cc
# Opt level: O2

void __thiscall leveldb::anon_unknown_2::FileState::Unref(FileState *this)

{
  int iVar1;
  
  std::mutex::lock((mutex *)this);
  iVar1 = this->refs_;
  this->refs_ = iVar1 + -1;
  if (iVar1 < 1) {
    __assert_fail("refs_ >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv.cc"
                  ,0x2e,"void leveldb::(anonymous namespace)::FileState::Unref()");
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  if (iVar1 == 1) {
    Truncate(this);
    std::_Vector_base<char_*,_std::allocator<char_*>_>::~_Vector_base
              (&(this->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>);
    operator_delete(this);
    return;
  }
  return;
}

Assistant:

void Unref() {
    bool do_delete = false;

    {
      MutexLock lock(&refs_mutex_);
      --refs_;
      assert(refs_ >= 0);
      if (refs_ <= 0) {
        do_delete = true;
      }
    }

    if (do_delete) {
      delete this;
    }
  }